

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Extent.hpp
# Opt level: O2

bool __thiscall Parfait::Extent<double>::contains(Extent<double> *this,Extent<double> *box)

{
  double *pdVar1;
  double dVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  do {
    uVar4 = uVar3;
    if ((uVar4 == 3) ||
       (dVar2 = (this->lo).pos._M_elems[uVar4], pdVar1 = (box->hi).pos._M_elems + uVar4,
       *pdVar1 <= dVar2 && dVar2 != *pdVar1)) break;
    dVar2 = (box->lo).pos._M_elems[uVar4];
    pdVar1 = (this->hi).pos._M_elems + uVar4;
    uVar3 = uVar4 + 1;
  } while (dVar2 < *pdVar1 || dVar2 == *pdVar1);
  return 2 < uVar4;
}

Assistant:

bool Extent<T>::contains(const Extent<T> &box) const {
    for (unsigned int i = 0; i < 3; i++) {
      if (box.hi[i] < lo[i]) {
        return false;
      }
      if (box.lo[i] > hi[i]) {
        return false;
      }
    }
    return true;
  }